

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdpy.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int local_1c;
  char **ppcStack_18;
  int ar_len;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  if (3 < argc) {
    Am_Error("** usage: testdpy [scrn1] [scrn2]\n");
  }
  wins_array = create_wins_array((int)argv_local,ppcStack_18,&local_1c);
  test_colors(wins_array,local_1c);
  test_fonts(wins_array,local_1c);
  test_bits(wins_array,local_1c);
  printf("Hit RETURN to exit:\n");
  getchar();
  return 0;
}

Assistant:

int
main(int argc, char **argv)
{

  if (argc > 3) {
    Am_Error("** usage: testdpy [scrn1] [scrn2]\n");
  };

  int ar_len;
  wins_array = create_wins_array(argc, argv, ar_len);

  test_colors(wins_array, ar_len);
  test_fonts(wins_array, ar_len);
  test_bits(wins_array, ar_len);
//  test_win_props (wins_array, ar_len);

///
///  Exit
///
#if _MACINTOSH
  // on the Macintosh, we need to be in the main loop in order to
  // get cursor changes correctly.

  cout << "Entering main loop" << endl;
  Am_Drawonable::Main_Loop();
#else
  // but on other machines we want to test for crash on exit.
  printf("Hit RETURN to exit:\n");
  getchar();
#endif

  return 0;
}